

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O3

int AF_A_FiredChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  SWORD *pSVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *actor;
  VMValue *pVVar9;
  char *__assertion;
  AActor *other;
  bool bVar10;
  bool bVar11;
  double dVar12;
  DAngle local_38;
  _func_int **local_30;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005de0b4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005de0a4;
  actor = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_005ddd7a;
    pPVar8 = (actor->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar6 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar6);
      (actor->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar10 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar8 == pPVar5;
    if (!bVar11 && !bVar10) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar5) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar7 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005de0b4;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_005de0a4;
LAB_005ddd7a:
    actor = (AActor *)0x0;
    pVVar9 = param;
    uVar7 = numparam;
  }
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_005de0a4:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005de0b4;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar8 = (PClass *)puVar3[1];
          if (pPVar8 == (PClass *)0x0) {
            pPVar8 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar9,uVar7,ret);
            puVar3[1] = pPVar8;
          }
          bVar10 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar5 && bVar10) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar10 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar5) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (!bVar10) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005de0b4;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_005de0a4;
    }
    if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005de0b4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  other = (actor->target).field_0.p;
  if (other == (AActor *)0x0) {
LAB_005dde58:
    other = (AActor *)0x0;
  }
  else if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (actor->target).field_0.p = (AActor *)0x0;
    goto LAB_005dde58;
  }
  if (actor->reactiontime != 0) {
    actor->reactiontime = actor->reactiontime + -1;
  }
  iVar6 = actor->special1;
  if (actor->threshold != 0) {
    actor->threshold = actor->threshold + -1;
  }
  dVar12 = FFastTrig::sin(&fasttrig,(double)iVar6 * 5.625 * 11930464.711111112 + 6755399441055744.0)
  ;
  dVar12 = dVar12 * 8.0 + (actor->__Pos).Z;
  (actor->__Pos).Z = dVar12;
  actor->special1 = iVar6 + 2U & 0x3f;
  if (dVar12 < actor->floorz + 64.0) {
    (actor->__Pos).Z = dVar12 + 2.0;
  }
  pAVar4 = (actor->target).field_0.p;
  if (pAVar4 == (AActor *)0x0) {
LAB_005ddf30:
    P_LookForPlayers(actor,1,(FLookExParams *)0x0);
    return 0;
  }
  if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (actor->target).field_0.p = (AActor *)0x0;
    goto LAB_005ddf30;
  }
  if (((pAVar4->flags).Value & 4) == 0) goto LAB_005ddf30;
  if (actor->special2 < 1) {
    actor->special2 = 0;
    (actor->Vel).X = 0.0;
    (actor->Vel).Y = 0.0;
    dVar12 = AActor::Distance2D(actor,other,false);
    if ((512.0 <= dVar12) || (uVar7 = FRandom::GenRand32(&pr_firedemonchase), 0x1d < (uVar7 & 0xfe))
       ) goto LAB_005ddffd;
    AActor::AngleTo((AActor *)&stack0xffffffffffffffd0,actor,SUB81(other,0));
    uVar7 = FRandom::GenRand32(&pr_firedemonchase);
    local_38.Degrees = (double)local_30 + *(double *)(&DAT_00765960 + (ulong)(-1 < (char)uVar7) * 8)
    ;
    AActor::Thrust(actor,&local_38,8.0);
    iVar6 = 3;
  }
  else {
    iVar6 = actor->special2 + -1;
  }
  actor->special2 = iVar6;
LAB_005ddffd:
  FaceMovementDirection(actor);
  if (actor->special2 == 0) {
    pSVar1 = &actor->movecount;
    *pSVar1 = *pSVar1 + -1;
    if ((*pSVar1 < 0) || (bVar10 = P_Move(actor), !bVar10)) {
      P_NewChaseDir(actor);
    }
  }
  uVar7 = (actor->flags).Value;
  if ((char)uVar7 < '\0') {
    (actor->flags).Value = uVar7 & 0xffffff7f;
  }
  else {
    bVar10 = P_CheckMissileRange(actor);
    if ((bVar10) && (uVar7 = FRandom::GenRand32(&pr_firedemonchase), (uVar7 & 0xfc) < 0x14)) {
      AActor::SetState(actor,actor->MissileState,false);
      *(byte *)&(actor->flags).Value = (byte)(actor->flags).Value | 0x80;
      return 0;
    }
  }
  uVar7 = FRandom::GenRand32(&pr_firedemonchase);
  if (2 < (uVar7 & 0xff)) {
    return 0;
  }
  AActor::PlayActiveSound(actor);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredChase)
{
	PARAM_ACTION_PROLOGUE;

	int weaveindex = self->special1;
	AActor *target = self->target;
	DAngle ang;
	double dist;

	if (self->reactiontime) self->reactiontime--;
	if (self->threshold) self->threshold--;

	// Float up and down
	self->AddZ(BobSin(weaveindex));
	self->special1 = (weaveindex + 2) & 63;

	// Ensure it stays above certain height
	if (self->Z() < self->floorz + 64)
	{
		self->AddZ(2);
	}

	if(!self->target || !(self->target->flags&MF_SHOOTABLE))
	{	// Invalid target
		P_LookForPlayers (self,true, NULL);
		return 0;
	}

	// Strafe
	if (self->special2 > 0)
	{
		self->special2--;
	}
	else
	{
		self->special2 = 0;
		self->Vel.X = self->Vel.Y = 0;
		dist = self->Distance2D(target);
		if (dist < FIREDEMON_ATTACK_RANGE)
		{
			if (pr_firedemonchase() < 30)
			{
				ang = self->AngleTo(target);
				if (pr_firedemonchase() < 128)
					ang += 90;
				else
					ang -= 90;
				self->Thrust(ang, 8);
				self->special2 = 3;		// strafe time
			}
		}
	}

	FaceMovementDirection (self);

	// Normal movement
	if (!self->special2)
	{
		if (--self->movecount<0 || !P_Move (self))
		{
			P_NewChaseDir (self);
		}
	}

	// Do missile attack
	if (!(self->flags & MF_JUSTATTACKED))
	{
		if (P_CheckMissileRange (self) && (pr_firedemonchase() < 20))
		{
			self->SetState (self->MissileState);
			self->flags |= MF_JUSTATTACKED;
			return 0;
		}
	}
	else
	{
		self->flags &= ~MF_JUSTATTACKED;
	}

	// make active sound
	if (pr_firedemonchase() < 3)
	{
		self->PlayActiveSound ();
	}
	return 0;
}